

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceStub.cpp
# Opt level: O3

bool __thiscall irr::CIrrDeviceStub::checkVersion(CIrrDeviceStub *this,char *version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double __x;
  stringc w;
  string<char> local_48;
  
  iVar2 = (*(this->super_IrrlichtDevice)._vptr_IrrlichtDevice[0x16])();
  iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),version);
  if (iVar2 != 0) {
    paVar1 = &local_48.str.field_2;
    local_48.str._M_string_length = 0;
    local_48.str.field_2._M_local_buf[0] = '\0';
    local_48.str._M_dataplus._M_p = (pointer)paVar1;
    core::string<char>::operator=(&local_48,"Warning: The library version of the Irrlicht Engine (")
    ;
    iVar3 = (*(this->super_IrrlichtDevice)._vptr_IrrlichtDevice[0x16])(this);
    core::string<char>::append(&local_48,(char *)CONCAT44(extraout_var_00,iVar3),0xffffffff);
    ::std::__cxx11::string::append((char *)&local_48,0x2367f3);
    core::string<char>::append(&local_48,version,0xffffffff);
    __x = (double)::std::__cxx11::string::append((char *)&local_48,0x236834);
    os::Printer::log((Printer *)local_48.str._M_dataplus._M_p,__x);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_48.str._M_dataplus._M_p,
                      CONCAT71(local_48.str.field_2._M_allocated_capacity._1_7_,
                               local_48.str.field_2._M_local_buf[0]) + 1);
    }
  }
  return iVar2 == 0;
}

Assistant:

bool CIrrDeviceStub::checkVersion(const char *version)
{
	if (strcmp(getVersion(), version)) {
		core::stringc w;
		w = "Warning: The library version of the Irrlicht Engine (";
		w += getVersion();
		w += ") does not match the version the application was compiled with (";
		w += version;
		w += "). This may cause problems.";
		os::Printer::log(w.c_str(), ELL_WARNING);

		return false;
	}

	return true;
}